

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O2

void __thiscall unittest::UnitTest::TestHashComment1(UnitTest *this)

{
  int iVar1;
  mapped_type *this_00;
  mapped_type *a;
  allocator<char> local_243;
  allocator<char> local_242;
  allocator<char> local_241;
  key_type local_240;
  key_type local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  Ini<char> ini;
  istringstream ss;
  
  inipp::Ini<char>::Ini(&ini);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"# hello world\n[default]\na=2",(allocator<char> *)&local_220);
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&local_240,_S_in);
  std::__cxx11::string::~string((string *)&local_240);
  iVar1 = (*(ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_Format[3])
                    (ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,0x23);
  Assert::IsFalse(SUB41(iVar1,0));
  inipp::Ini<char>::parse(&ini,(basic_istream<char,_std::char_traits<char>_> *)&ss);
  WriteMessage<char>(&ini);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"default",&local_241);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::at(&ini.sections,&local_240);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"a",&local_242);
  a = std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::at(this_00,&local_220);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"2",&local_243);
  Assert::AreEqual<std::__cxx11::string>(a,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  Assert::IsFalse(ini.errors.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&ini.errors);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  inipp::Ini<char>::~Ini(&ini);
  return;
}

Assistant:

TEST_METHOD(TestHashComment1)
		{
			Ini<char> ini;
			std::istringstream ss("# hello world\n[default]\na=2");
			Assert::IsFalse(ini.format->is_comment('#'));
			ini.parse(ss);
			WriteMessage(ini);
			Assert::AreEqual(ini.sections.at("default").at("a"), std::string("2"));
			Assert::IsFalse(ini.errors.empty());
		}